

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FboColorTexCubeArrayCase::render
          (FboColorTexCubeArrayCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  bool bVar1;
  deUint32 dVar2;
  uint uVar3;
  DataType DVar4;
  ContextType type;
  GLSLVersion glslVersion;
  int iVar5;
  int height;
  DataTypes *samplerTypes;
  Context *pCVar6;
  TransferFormat TVar7;
  size_t n;
  long lVar8;
  TextureFormat TVar9;
  int ndx;
  int iVar10;
  CubeFace face;
  float fVar11;
  deUint32 tex;
  TextureFormat local_5d8;
  deUint32 local_5cc;
  deUint32 local_5c8;
  deUint32 tmpTex;
  Vec4 retVal;
  TextureFormat texFmt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  vector<int,_std::allocator<int>_> order;
  Vector<float,_4> local_570;
  Vec3 p0;
  void *local_540;
  Random rnd;
  TextureFormatInfo fmtInfo;
  deUint32 layerFbo;
  ostringstream local_4e0 [376];
  TextureCubeArrayShader arrayTexShader;
  Texture2DShader texToFboShader;
  
  local_5d8 = (TextureFormat)
              ((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  dVar2 = deStringHash((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar3 = tcu::CommandLine::getBaseSeed
                    (((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                      super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  deRandom_init(&rnd.m_rnd,dVar2 ^ uVar3 ^ 0xed607a89);
  texFmt = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  arrayTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  arrayTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  arrayTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)&arrayTexShader,TYPE_SAMPLER_2D);
  DVar4 = FboTestUtil::getFragmentOutputType(&texFmt);
  tcu::operator-((tcu *)&layerFbo,&fmtInfo.valueMax,&fmtInfo.valueMin);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,samplerTypes,DVar4,(Vec4 *)&layerFbo,&fmtInfo.valueMin);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&arrayTexShader);
  DVar4 = glu::getSamplerCubeArrayType(texFmt);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  FboTestUtil::TextureCubeArrayShader::TextureCubeArrayShader
            (&arrayTexShader,DVar4,TYPE_FLOAT_VEC4,glslVersion);
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_5cc = (*pCVar6->_vptr_Context[0x75])(pCVar6,&texToFboShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_5c8 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&arrayTexShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,pCVar6,local_5cc);
  FboTestUtil::TextureCubeArrayShader::setTexScaleBias
            (&arrayTexShader,&fmtInfo.lookupScale,&fmtInfo.lookupBias);
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar7 = glu::getTransferFormat(texFmt);
  bVar1 = glu::isGLInternalColorFormatFilterable((this->super_FboColorbufferCase).m_format);
  _layerFbo = local_5d8;
  std::__cxx11::ostringstream::ostringstream(local_4e0);
  std::operator<<((ostream *)local_4e0,"Creating a cube map array texture (");
  std::ostream::operator<<(local_4e0,*(int *)&(this->super_FboColorbufferCase).field_0x8c);
  std::operator<<((ostream *)local_4e0,"x");
  std::ostream::operator<<(local_4e0,*(int *)&this->field_0x90);
  std::operator<<((ostream *)local_4e0,", depth: ");
  std::ostream::operator<<(local_4e0,*(int *)&this->field_0x94);
  std::operator<<((ostream *)local_4e0,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&layerFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_4e0);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x8072,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2801,bVar1 | 0x2600);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2800,bVar1 | 0x2600);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x9009,0,(this->super_FboColorbufferCase).m_format,
             *(int *)&(this->super_FboColorbufferCase).field_0x8c,*(int *)&this->field_0x90,
             *(int *)&this->field_0x94,0,TVar7.format,TVar7.dataType,(void *)0x0);
  _layerFbo = local_5d8;
  std::__cxx11::ostringstream::ostringstream(local_4e0);
  std::operator<<((ostream *)local_4e0,"Creating a framebuffer object for each layer-face");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&layerFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_4e0);
  for (iVar10 = 0; iVar10 < *(int *)&this->field_0x94; iVar10 = iVar10 + 1) {
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,&layerFbo);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,layerFbo);
    sglr::ContextWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce0,tex,0,iVar10);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&fbos,&layerFbo);
  }
  _layerFbo = local_5d8;
  std::__cxx11::ostringstream::ostringstream(local_4e0);
  std::operator<<((ostream *)local_4e0,"Rendering test images to layer-faces in randomized order");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&layerFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_4e0);
  std::vector<int,_std::allocator<int>_>::vector
            (&order,(long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&layerFbo)
  ;
  for (lVar8 = 0;
      (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start >> 2 != lVar8; lVar8 = lVar8 + 1) {
    order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar8] = (int)lVar8;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  TVar9.order = R;
  TVar9.type = SNORM_INT8;
  while ((ulong)TVar9 <
         (ulong)((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2)) {
    iVar10 = order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(long)TVar9];
    tmpTex = 0;
    dVar2 = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar10];
    local_5d8 = TVar9;
    p0.m_data._0_8_ = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&layerFbo,(TextureFormat *)&p0,0x80,0x80,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&layerFbo);
    tcu::Vector<float,_4>::Vector(&retVal);
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    retVal.m_data[0] = fVar11;
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    retVal.m_data[1] = fVar11;
    retVal.m_data[2] = deRandom_getFloat(&rnd.m_rnd);
    retVal.m_data[3] = 1.0;
    tcu::Vector<float,_4>::Vector(&local_570,0.0);
    tcu::fillWithGrid((PixelBufferAccess *)&p0,8,&retVal,&local_570);
    sglr::ContextWrapper::glGenTextures(this_00,1,&tmpTex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tmpTex);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&layerFbo);
    sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,local_540);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,dVar2);
    sglr::ContextWrapper::glViewport
              (this_00,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,
               *(int *)&this->field_0x90);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    p0.m_data[0] = -1.0;
    p0.m_data[1] = -1.0;
    p0.m_data[2] = 0.0;
    retVal.m_data[0] = 1.0;
    retVal.m_data[1] = 1.0;
    retVal.m_data[2] = 0.0;
    sglr::drawQuad(pCVar6,local_5cc,&p0,(Vec3 *)&retVal);
    FboTestCase::checkError((FboTestCase *)this);
    p0.m_data[1] = (float)((ulong)local_5d8 >> 1) + -1.0;
    p0.m_data[0] = (float)(int)((local_5d8.order & A) - A);
    p0.m_data[2] = 0.0;
    local_570.m_data[0] = 1.0;
    local_570.m_data[1] = 1.0;
    local_570.m_data[2] = 0.0;
    tcu::operator+((tcu *)&retVal,(Vector<float,_3> *)&p0,(Vector<float,_3> *)&local_570);
    face = CUBEFACE_LAST;
    if ((uint)((long)iVar10 % 6) < 6) {
      face = *(CubeFace *)(&DAT_018a8adc + ((long)iVar10 % 6 & 0xffffffffU) * 4);
    }
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
    iVar5 = sglr::ContextWrapper::getWidth(this_00);
    height = sglr::ContextWrapper::getHeight(this_00);
    sglr::ContextWrapper::glViewport(this_00,0,0,iVar5,height);
    sglr::ContextWrapper::glActiveTexture(this_00,0x84c0);
    sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
    FboTestUtil::TextureCubeArrayShader::setLayer(&arrayTexShader,iVar10 / 6);
    FboTestUtil::TextureCubeArrayShader::setFace(&arrayTexShader,face);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::TextureCubeArrayShader::setUniforms(&arrayTexShader,pCVar6,local_5c8);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    sglr::drawQuad(pCVar6,local_5c8,&p0,(Vec3 *)&retVal);
    FboTestCase::checkError((FboTestCase *)this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&layerFbo);
    TVar9 = (TextureFormat)((long)local_5d8 + 1);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&order.super__Vector_base<int,_std::allocator<int>_>);
  iVar10 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar10,iVar5);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  sglr::ShaderProgram::~ShaderProgram(&arrayTexShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		TestLog&				log					= m_testCtx.getLog();
		de::Random				rnd					(deStringHash(getName()) ^ 0xed607a89 ^ m_testCtx.getCommandLine().getBaseSeed());
		tcu::TextureFormat		texFmt				= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		TextureCubeArrayShader	arrayTexShader		(glu::getSamplerCubeArrayType(texFmt), glu::TYPE_FLOAT_VEC4, glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()));

		deUint32				texToFboShaderID	= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				arrayTexShaderID	= getCurrentContext()->createProgram(&arrayTexShader);

		// Setup textures
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		arrayTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat	transferFmt		= glu::getTransferFormat(texFmt);
			bool				isFilterable	= glu::isGLInternalColorFormatFilterable(m_format);
			const IVec3&		size			= m_texSize;

			log << TestLog::Message
				<< "Creating a cube map array texture ("
				<< size.x() << "x" << size.y()
				<< ", depth: "
				<< size.z() << ")"
				<< TestLog::EndMessage;

			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_format, size.x(), size.y(), size.z(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			log << TestLog::Message << "Creating a framebuffer object for each layer-face" << TestLog::EndMessage;

			// Generate an FBO for each layer-face
			for (int ndx = 0; ndx < m_texSize.z(); ndx++)
			{
				deUint32 layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, tex, 0, ndx);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		log << TestLog::Message << "Rendering test images to layer-faces in randomized order" << TestLog::EndMessage;

		{
			std::vector<int> order(fbos.size());

			for (size_t n = 0; n < order.size(); n++)
				order[n] = (int)n;
			rnd.shuffle(order.begin(), order.end());

			for (size_t ndx = 0; ndx < order.size(); ndx++)
			{
				const int			layerFace	= order[ndx];
				const deUint32		format		= GL_RGBA;
				const deUint32		dataType	= GL_UNSIGNED_BYTE;
				const int			texW		= 128;
				const int			texH		= 128;
				deUint32			tmpTex		= 0;
				const deUint32		fbo			= fbos[layerFace];
				const IVec3&		viewport	= m_texSize;
				tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

				tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

				glGenTextures(1, &tmpTex);
				glBindTexture(GL_TEXTURE_2D, tmpTex);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
				glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

				glBindFramebuffer(GL_FRAMEBUFFER, fbo);
				glViewport(0, 0, viewport.x(), viewport.y());
				sglr::drawQuad(*getCurrentContext(), texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
				checkError();

				// Render to framebuffer
				{
					const Vec3			p0		= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
					const Vec3			p1		= p0 + Vec3(1.0f, 1.0f, 0.0f);
					const int			layer	= layerFace / 6;
					const tcu::CubeFace	face	= getCubeFaceFromNdx(layerFace % 6);

					glBindFramebuffer(GL_FRAMEBUFFER, 0);
					glViewport(0, 0, getWidth(), getHeight());

					glActiveTexture(GL_TEXTURE0);
					glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);

					arrayTexShader.setLayer(layer);
					arrayTexShader.setFace(face);
					arrayTexShader.setUniforms(*getCurrentContext(), arrayTexShaderID);

					sglr::drawQuad(*getCurrentContext(), arrayTexShaderID, p0, p1);
					checkError();
				}
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}